

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# variant.hpp
# Opt level: O0

bool goodform::detail::can_int_fit_value<unsigned_int,long>(long value)

{
  bool local_31;
  uintmax_t val_type_max;
  uintmax_t int_type_max;
  intmax_t val_type_min;
  intmax_t int_type_min;
  long value_local;
  
  local_31 = 0xffffffff < (ulong)value;
  return (bool)((local_31 ^ 0xffU) & 1);
}

Assistant:

bool can_int_fit_value(const ValT value)
    {
      const intmax_t int_type_min = intmax_t(std::numeric_limits<IntT>::min());
      const intmax_t val_type_min = intmax_t(std::numeric_limits<ValT>::min());
      const uintmax_t int_type_max = uintmax_t(std::numeric_limits<IntT>::max());
      const uintmax_t val_type_max = uintmax_t(std::numeric_limits<ValT>::max());
      return !( (int_type_min > val_type_min && value < static_cast<ValT>(int_type_min)) || (int_type_max < val_type_max && value > static_cast<ValT>(int_type_max)) );
    }